

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

Token * __thiscall YAML::Scanner::PushToken(Scanner *this,TYPE type)

{
  TYPE type_;
  reference pvVar1;
  undefined4 in_ESI;
  Stream *in_RDI;
  undefined4 in_stack_ffffffffffffff50;
  Token local_68;
  
  type_ = (TYPE)((ulong)(in_RDI + 1) >> 0x20);
  YAML::Stream::mark(in_RDI);
  Token::Token(&local_68,type_,(Mark *)CONCAT44(in_ESI,in_stack_ffffffffffffff50));
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             CONCAT44(in_ESI,in_stack_ffffffffffffff50),(value_type *)in_RDI);
  Token::~Token((Token *)CONCAT44(in_ESI,in_stack_ffffffffffffff50));
  pvVar1 = std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::back
                     ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
                      0xf1675c);
  return pvVar1;
}

Assistant:

Token* Scanner::PushToken(Token::TYPE type) {
  m_tokens.push(Token(type, INPUT.mark()));
  return &m_tokens.back();
}